

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_OneFlagRef_Test::~TApp_OneFlagRef_Test(TApp_OneFlagRef_Test *this)

{
  TApp_OneFlagRef_Test *this_local;
  
  ~TApp_OneFlagRef_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, OneFlagRef) {
    int ref;
    app.add_flag("-c,--count", ref);
    args = {"--count"};
    run();
    EXPECT_EQ((size_t)1, app.count("-c"));
    EXPECT_EQ((size_t)1, app.count("--count"));
    EXPECT_EQ(1, ref);
}